

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O0

void __thiscall CEmoticon::OnConsoleInit(CEmoticon *this)

{
  IConsole *pIVar1;
  undefined8 in_RDI;
  
  pIVar1 = CComponent::Console((CComponent *)0x161a7c);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+emote","",2,ConKeyEmoticon,in_RDI,"Open emote selector");
  pIVar1 = CComponent::Console((CComponent *)0x161ab9);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"emote","i[emote-id]",2,ConEmote,in_RDI,"Use emote");
  return;
}

Assistant:

void CEmoticon::OnConsoleInit()
{
	Console()->Register("+emote", "", CFGFLAG_CLIENT, ConKeyEmoticon, this, "Open emote selector");
	Console()->Register("emote", "i[emote-id]", CFGFLAG_CLIENT, ConEmote, this, "Use emote");
}